

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::ReplaceChannel
               (Image *channel,uint32_t startXChannel,uint32_t startYChannel,Image *rgb,
               uint32_t startXRgb,uint32_t startYRgb,uint32_t width,uint32_t height,
               uint8_t channelId)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint8_t colorCount;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  uchar *local_48;
  uint32_t in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8
            );
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in_stack_ffffffffffffff90);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in_stack_ffffffffffffff90);
  if (2 < in_stack_00000018) {
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar4 = puVar4 + (ulong)in_ESI + (ulong)(in_EDX * uVar1);
  local_48 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  local_48 = local_48 +
             (long)(int)(uint)in_stack_00000018 +
             (ulong)(uint)(in_R8D * 3) + (ulong)(in_R9D * uVar2);
  puVar5 = local_48 + in_stack_00000010 * uVar2;
  for (; local_48 != puVar5; local_48 = local_48 + uVar2) {
    puVar7 = puVar4;
    for (puVar6 = local_48; puVar6 != local_48 + (uint)(in_stack_00000008 * 3); puVar6 = puVar6 + 3)
    {
      *puVar6 = *puVar7;
      puVar7 = puVar7 + 1;
    }
    puVar4 = puVar4 + uVar1;
  }
  return;
}

Assistant:

void ReplaceChannel( const Image & channel, uint32_t startXChannel, uint32_t startYChannel, Image & rgb, uint32_t startXRgb, uint32_t startYRgb,
                         uint32_t width, uint32_t height, uint8_t channelId )
    {
        ParameterValidation( channel, startXChannel, startYChannel, rgb, startXRgb, startYRgb, width, height );
        VerifyGrayScaleImage( channel );
        VerifyRGBImage( rgb );

        if ( channelId >= RGB )
            throw imageException( "Channel ID is greater than number of channels in RGB image" );

        const uint32_t rowSizeIn  = channel.rowSize();
        const uint32_t rowSizeOut = rgb.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = channel.data() + startYChannel * rowSizeIn  + startXChannel;
        uint8_t       * outY = rgb.data() + startYRgb * rowSizeOut + startXRgb * colorCount + channelId;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for ( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for ( ; outX != outXEnd; outX += colorCount, ++inX )
                *outX = *inX;
        }
    }